

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

cmServerProtocol *
cmServer::FindMatchingProtocol
          (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *protocols,int major,
          int minor)

{
  pointer ppcVar1;
  int iVar2;
  int extraout_var;
  int extraout_var_00;
  pointer ppcVar3;
  cmServerProtocol *pcVar4;
  cmServerProtocol *pcVar5;
  
  ppcVar3 = (protocols->super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (protocols->super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar3 == ppcVar1) {
    pcVar4 = (cmServerProtocol *)0x0;
  }
  else {
    pcVar4 = (cmServerProtocol *)0x0;
    do {
      pcVar5 = *ppcVar3;
      iVar2 = (*pcVar5->_vptr_cmServerProtocol[2])(pcVar5);
      if (iVar2 == major) {
        if (extraout_var == minor) {
          return pcVar5;
        }
        if ((pcVar4 == (cmServerProtocol *)0x0) ||
           ((*pcVar4->_vptr_cmServerProtocol[2])(pcVar4), extraout_var_00 < extraout_var)) {
          pcVar4 = pcVar5;
        }
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 != ppcVar1);
  }
  pcVar5 = (cmServerProtocol *)0x0;
  if (minor < 0) {
    pcVar5 = pcVar4;
  }
  return pcVar5;
}

Assistant:

cmServerProtocol* cmServer::FindMatchingProtocol(
  const std::vector<cmServerProtocol*>& protocols, int major, int minor)
{
  cmServerProtocol* bestMatch = nullptr;
  for (auto protocol : protocols) {
    auto version = protocol->ProtocolVersion();
    if (major != version.first) {
      continue;
    }
    if (minor == version.second) {
      return protocol;
    }
    if (!bestMatch || bestMatch->ProtocolVersion().second < version.second) {
      bestMatch = protocol;
    }
  }
  return minor < 0 ? bestMatch : nullptr;
}